

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O1

void Search::allowed_actions_to_label
               (search_private *priv,size_t ec_cnt,action *allowed_actions,
               size_t allowed_actions_cnt,float *allowed_actions_cost,action *oracle_actions,
               size_t oracle_actions_cnt,polylabel *lab)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  uint32_t uVar4;
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  action aVar8;
  char cVar9;
  bool bVar10;
  float fVar11;
  cb_class local_50;
  size_t local_40;
  size_t local_38;
  
  bVar1 = priv->cb_learner;
  local_40 = allowed_actions_cnt;
  if (priv->is_ldf == true) {
    if (bVar1 == false) {
      v_array<COST_SENSITIVE::wclass>::clear((v_array<COST_SENSITIVE::wclass> *)&lab->simple);
    }
    else {
      v_array<CB::cb_class>::clear((v_array<CB::cb_class> *)&lab->simple);
    }
    if (ec_cnt != 0) {
      bVar10 = oracle_actions_cnt != 0;
      local_40 = CONCAT71(local_40._1_7_,bVar10);
      uVar3 = 0;
      do {
        aVar8 = (action)uVar3;
        cVar9 = oracle_actions != (action *)0x0 && bVar10;
        if ((oracle_actions != (action *)0x0 && bVar10) &&
           (cVar9 = (char)local_40, *oracle_actions != aVar8)) {
          uVar3 = 1;
          do {
            uVar5 = uVar3;
            if (oracle_actions_cnt == uVar5) break;
            uVar3 = uVar5 + 1;
          } while (oracle_actions[uVar5] != aVar8);
          cVar9 = uVar5 < oracle_actions_cnt;
        }
        local_50.cost = 0.0;
        if (cVar9 == '\0') {
          local_50.cost = 1.0;
        }
        local_50.action = aVar8;
        if (bVar1 == false) {
          local_50.probability = 0.0;
          local_50.partial_prediction = 0.0;
          v_array<COST_SENSITIVE::wclass>::push_back
                    ((v_array<COST_SENSITIVE::wclass> *)&lab->simple,(wclass *)&local_50);
        }
        else {
          local_50.probability = 0.0;
          local_50.partial_prediction = 0.0;
          v_array<CB::cb_class>::push_back((v_array<CB::cb_class> *)&lab->simple,&local_50);
        }
        uVar3 = (ulong)(aVar8 + 1);
      } while (uVar3 < ec_cnt);
    }
  }
  else if (priv->use_action_costs == true) {
    if (allowed_actions == (action *)0x0) {
      if ((long)(lab->cs).costs._end - (long)(lab->cs).costs._begin >> 4 != priv->A) {
        if (bVar1 == false) {
          v_array<COST_SENSITIVE::wclass>::clear((v_array<COST_SENSITIVE::wclass> *)&lab->simple);
        }
        else {
          v_array<CB::cb_class>::clear((v_array<CB::cb_class> *)&lab->simple);
        }
        if (priv->A != 0) {
          uVar3 = 1;
          do {
            uVar4 = (uint32_t)uVar3;
            local_50.action = uVar4;
            if (bVar1 == false) {
              local_50.cost = 0.0;
              local_50.probability = 0.0;
              local_50.partial_prediction = 0.0;
              v_array<COST_SENSITIVE::wclass>::push_back
                        ((v_array<COST_SENSITIVE::wclass> *)&lab->simple,(wclass *)&local_50);
            }
            else {
              local_50.cost = 0.0;
              local_50.probability = 0.0;
              local_50.partial_prediction = 0.0;
              v_array<CB::cb_class>::push_back((v_array<CB::cb_class> *)&lab->simple,&local_50);
            }
            bVar10 = uVar3 < priv->A;
            uVar3 = (ulong)(uVar4 + 1);
          } while (bVar10);
        }
      }
      if (priv->A != 0) {
        uVar2 = 1;
        uVar3 = 0;
        do {
          (lab->cs).costs._begin[uVar3].x = allowed_actions_cost[uVar3];
          uVar3 = (ulong)uVar2;
          uVar2 = uVar2 + 1;
        } while (uVar3 < priv->A);
      }
    }
    else {
      if (bVar1 == false) {
        v_array<COST_SENSITIVE::wclass>::clear((v_array<COST_SENSITIVE::wclass> *)&lab->simple);
      }
      else {
        v_array<CB::cb_class>::clear((v_array<CB::cb_class> *)&lab->simple);
      }
      if (local_40 != 0) {
        uVar3 = 0;
        uVar5 = 1;
        do {
          local_50.action = allowed_actions[uVar3];
          local_50.cost = allowed_actions_cost[uVar3];
          if (bVar1 == false) {
            local_50.probability = 0.0;
            local_50.partial_prediction = 0.0;
            v_array<COST_SENSITIVE::wclass>::push_back
                      ((v_array<COST_SENSITIVE::wclass> *)&lab->simple,(wclass *)&local_50);
          }
          else {
            local_50.probability = 0.0;
            local_50.partial_prediction = 0.0;
            v_array<CB::cb_class>::push_back((v_array<CB::cb_class> *)&lab->simple,&local_50);
          }
          bVar10 = uVar5 < local_40;
          uVar3 = uVar5;
          uVar5 = (ulong)((int)uVar5 + 1);
        } while (bVar10);
      }
    }
  }
  else if (allowed_actions == (action *)0x0 || allowed_actions_cnt == 0) {
    local_40 = (long)(lab->cs).costs._end - (long)(lab->cs).costs._begin >> 4;
    local_38 = priv->A;
    if (local_40 != local_38) {
      if (bVar1 == false) {
        v_array<COST_SENSITIVE::wclass>::clear((v_array<COST_SENSITIVE::wclass> *)&lab->simple);
      }
      else {
        v_array<CB::cb_class>::clear((v_array<CB::cb_class> *)&lab->simple);
      }
      if (priv->A != 0) {
        uVar3 = 1;
        do {
          uVar4 = (uint32_t)uVar3;
          local_50.action = uVar4;
          if (bVar1 == false) {
            local_50.cost = 1.0;
            local_50.probability = 0.0;
            local_50.partial_prediction = 0.0;
            v_array<COST_SENSITIVE::wclass>::push_back
                      ((v_array<COST_SENSITIVE::wclass> *)&lab->simple,(wclass *)&local_50);
          }
          else {
            local_50.cost = 1.0;
            local_50.probability = 0.0;
            local_50.partial_prediction = 0.0;
            v_array<CB::cb_class>::push_back((v_array<CB::cb_class> *)&lab->simple,&local_50);
          }
          bVar10 = uVar3 < priv->A;
          uVar3 = (ulong)(uVar4 + 1);
        } while (bVar10);
      }
    }
    if (oracle_actions_cnt < 2) {
      if (priv->A != 0 && local_40 == local_38) {
        uVar2 = 1;
        uVar3 = 0;
        do {
          (lab->cs).costs._begin[uVar3].x = 1.0;
          uVar3 = (ulong)uVar2;
          uVar2 = uVar2 + 1;
        } while (uVar3 < priv->A);
      }
      if (oracle_actions_cnt == 1) {
        (lab->cs).costs._begin[*oracle_actions - 1].x = 0.0;
      }
    }
    else if (priv->A != 0) {
      uVar3 = 0;
      uVar2 = 0;
      do {
        uVar2 = uVar2 + 1;
        fVar11 = 1.0;
        if ((oracle_actions != (action *)0x0) && (fVar11 = 0.0, *oracle_actions != uVar2)) {
          uVar5 = 1;
          do {
            uVar7 = uVar5;
            if (oracle_actions_cnt == uVar7) break;
            uVar5 = uVar7 + 1;
          } while (oracle_actions[uVar7] != uVar2);
          fVar11 = 0.0;
          if (oracle_actions_cnt <= uVar7) {
            fVar11 = 1.0;
          }
        }
        (lab->cs).costs._begin[uVar3].x = fVar11;
        uVar3 = (ulong)uVar2;
      } while (uVar3 < priv->A);
    }
  }
  else {
    if (bVar1 == false) {
      v_array<COST_SENSITIVE::wclass>::clear((v_array<COST_SENSITIVE::wclass> *)&lab->simple);
    }
    else {
      v_array<CB::cb_class>::clear((v_array<CB::cb_class> *)&lab->simple);
    }
    if (local_40 != 0) {
      bVar10 = oracle_actions_cnt != 0;
      local_38 = CONCAT71(local_38._1_7_,bVar10);
      sVar6 = 0;
      do {
        local_50.action = allowed_actions[sVar6];
        cVar9 = oracle_actions != (action *)0x0 && bVar10;
        if ((oracle_actions != (action *)0x0 && bVar10) &&
           (cVar9 = (char)local_38, *oracle_actions != local_50.action)) {
          uVar3 = 1;
          do {
            uVar5 = uVar3;
            if (oracle_actions_cnt == uVar5) break;
            uVar3 = uVar5 + 1;
          } while (oracle_actions[uVar5] != local_50.action);
          cVar9 = uVar5 < oracle_actions_cnt;
        }
        local_50.cost = 0.0;
        if (cVar9 == '\0') {
          local_50.cost = 1.0;
        }
        if (bVar1 == false) {
          local_50.probability = 0.0;
          local_50.partial_prediction = 0.0;
          v_array<COST_SENSITIVE::wclass>::push_back
                    ((v_array<COST_SENSITIVE::wclass> *)&lab->simple,(wclass *)&local_50);
        }
        else {
          local_50.probability = 0.0;
          local_50.partial_prediction = 0.0;
          v_array<CB::cb_class>::push_back((v_array<CB::cb_class> *)&lab->simple,&local_50);
        }
        sVar6 = sVar6 + 1;
      } while (sVar6 != local_40);
    }
  }
  return;
}

Assistant:

void allowed_actions_to_label(search_private& priv, size_t ec_cnt, const action* allowed_actions,
    size_t allowed_actions_cnt, const float* allowed_actions_cost, const action* oracle_actions,
    size_t oracle_actions_cnt, polylabel& lab)
{
  bool isCB = priv.cb_learner;
  if (priv.is_ldf)  // LDF version easier
  {
    cs_costs_erase(isCB, lab);
    for (action k = 0; k < ec_cnt; k++)
      cs_cost_push_back(isCB, lab, k, array_contains<action>(k, oracle_actions, oracle_actions_cnt) ? 0.f : 1.f);
    // cerr << "lab = ["; for (size_t i=0; i<lab.cs.costs.size(); i++) cdbg << ' ' << lab.cs.costs[i].class_index << ':'
    // << lab.cs.costs[i].x; cdbg << " ]" << endl;
  }
  else if (priv.use_action_costs)
  {
    // TODO: Weight
    if (allowed_actions == nullptr)
    {
      if (cs_get_costs_size(isCB, lab) != priv.A)
      {
        cs_costs_erase(isCB, lab);
        for (action k = 0; k < priv.A; k++) cs_cost_push_back(isCB, lab, k + 1, 0.);
      }
      for (action k = 0; k < priv.A; k++) cs_set_cost_loss(isCB, lab, k, allowed_actions_cost[k]);
    }
    else  // manually specified actions
    {
      cs_costs_erase(isCB, lab);
      for (action k = 0; k < allowed_actions_cnt; k++)
        cs_cost_push_back(isCB, lab, allowed_actions[k], allowed_actions_cost[k]);
    }
  }
  else  // non-LDF, no action costs
  {
    if ((allowed_actions == nullptr) || (allowed_actions_cnt == 0))  // any action is allowed
    {
      bool set_to_one = false;
      if (cs_get_costs_size(isCB, lab) != priv.A)
      {
        cs_costs_erase(isCB, lab);
        for (action k = 0; k < priv.A; k++) cs_cost_push_back(isCB, lab, k + 1, 1.);
        set_to_one = true;
      }
      // cerr << "lab = ["; for (size_t i=0; i<lab.cs.costs.size(); i++) cdbg << ' ' << lab.cs.costs[i].class_index <<
      // ':' << lab.cs.costs[i].x; cdbg << " ]" << endl;
      if (oracle_actions_cnt <= 1)  // common case to speed up
      {
        if (!set_to_one)
          for (action k = 0; k < priv.A; k++) cs_set_cost_loss(isCB, lab, k, 1.);
        if (oracle_actions_cnt == 1)
          cs_set_cost_loss(isCB, lab, oracle_actions[0] - 1, 0.);
      }
      else
      {
        for (action k = 0; k < priv.A; k++)
          cs_set_cost_loss(isCB, lab, k, array_contains<action>(k + 1, oracle_actions, oracle_actions_cnt) ? 0.f : 1.f);
      }
    }
    else  // only some actions are allowed
    {
      cs_costs_erase(isCB, lab);
      float w = 1.;  // array_contains<action>(3, oracle_actions, oracle_actions_cnt) ? 5.f : 1.f;
      for (size_t i = 0; i < allowed_actions_cnt; i++)
      {
        action k = allowed_actions[i];
        cs_cost_push_back(
            isCB, lab, k, (array_contains<action>(k, oracle_actions, oracle_actions_cnt)) ? 0.f : w);  // 1.f );
      }
    }
  }
}